

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::RecreateBuffersTest<16384U>::render
          (RecreateBuffersTest<16384U> *this,Context *ctx,Surface *dst)

{
  deUint32 program;
  deUint32 dVar1;
  FboConfig *pFVar2;
  Vector<float,_3> local_204;
  Vector<float,_3> local_1f8;
  deUint32 local_1ec;
  deUint32 colorbuf;
  Vector<float,_3> local_1dc;
  undefined1 local_1d0 [8];
  Framebuffer fbo;
  bool stencil;
  deUint32 quadsTex;
  deUint32 metaballsTex;
  int height;
  int width;
  undefined1 local_178 [4];
  deUint32 texShaderID;
  SingleTex2DShader texShader;
  Surface *dst_local;
  Context *ctx_local;
  RecreateBuffersTest<16384U> *this_local;
  
  texShader.super_ShaderProgram._336_8_ = dst;
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_178);
  program = (*ctx->_vptr_Context[0x75])(ctx,(SingleTex2DShader *)local_178);
  fbo.m_stencilbuffer = 2;
  pFVar2 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  fbo.m_depthbuffer._3_1_ = pFVar2->stencilbufferType != 0;
  createQuadsTex2D(ctx,fbo.m_stencilbuffer,0x1907,0x1401,0x40,0x40);
  createMetaballsTex2D(ctx,1,0x1907,0x1401,0x40,0x40);
  pFVar2 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Framebuffer::Framebuffer((Framebuffer *)local_1d0,ctx,pFVar2,0x80,0x80,0,0,0,0);
  Framebuffer::checkCompleteness((Framebuffer *)local_1d0);
  SingleTex2DShader::setUnit((SingleTex2DShader *)local_178,ctx,program,0);
  dVar1 = Framebuffer::getFramebuffer((Framebuffer *)local_1d0);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)dVar1);
  (*ctx->_vptr_Context[5])(ctx,0,0,0x80,0x80);
  (*ctx->_vptr_Context[0x2a])(0x3f800000,0);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_stencilbuffer);
  tcu::Vector<float,_3>::Vector(&local_1dc,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffffe18,1.0,1.0,0.0);
  sglr::drawQuad(ctx,program,&local_1dc,(Vec3 *)&stack0xfffffffffffffe18);
  if ((fbo.m_depthbuffer._3_1_ & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xc11);
    (*ctx->_vptr_Context[0x32])(ctx,0x20,0x20,0x40,0x40);
    (*ctx->_vptr_Context[0x2c])(ctx,1);
    (*ctx->_vptr_Context[0x2d])(ctx,0x400);
    (*ctx->_vptr_Context[0x34])(ctx,0xc11);
  }
  if ((this->m_rebind & 1U) == 0) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
  }
  local_1ec = Framebuffer::getColorbuffer((Framebuffer *)local_1d0);
  pFVar2 = Framebuffer::getConfig((Framebuffer *)local_1d0);
  if (pFVar2->colorbufferType == 0xde1) {
    (*ctx->_vptr_Context[8])(ctx,1,&local_1ec);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)local_1ec);
    pFVar2 = Framebuffer::getConfig((Framebuffer *)local_1d0);
    (*ctx->_vptr_Context[0x7e])(ctx,0xde1,0,(ulong)pFVar2->colorbufferFormat,0x80,0x80);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2601);
    if ((this->m_rebind & 1U) != 0) {
      (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,0x8ce0,0xde1,(ulong)local_1ec,0);
    }
  }
  else if (pFVar2->colorbufferType == 0x8d41) {
    (*ctx->_vptr_Context[0xe])(ctx,1,&local_1ec);
    (*ctx->_vptr_Context[0xc])(ctx,0x8d41,(ulong)local_1ec);
    pFVar2 = Framebuffer::getConfig((Framebuffer *)local_1d0);
    (*ctx->_vptr_Context[0x23])(ctx,0x8d41,(ulong)pFVar2->colorbufferFormat,0x80,0x80);
    if ((this->m_rebind & 1U) != 0) {
      (*ctx->_vptr_Context[0x20])(ctx,0x8d40,0x8ce0,0x8d41,(ulong)local_1ec);
    }
  }
  if ((this->m_rebind & 1U) == 0) {
    dVar1 = Framebuffer::getFramebuffer((Framebuffer *)local_1d0);
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)dVar1);
  }
  (*ctx->_vptr_Context[0x2a])(0,0,0x3f800000);
  (*ctx->_vptr_Context[0x2c])(ctx,0);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4000);
  if ((fbo.m_depthbuffer._3_1_ & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xb90);
    (*ctx->_vptr_Context[0x35])(ctx,0x202,0,0xff);
  }
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  tcu::Vector<float,_3>::Vector(&local_1f8,-1.0,-1.0,1.0);
  tcu::Vector<float,_3>::Vector(&local_204,1.0,1.0,-1.0);
  sglr::drawQuad(ctx,program,&local_1f8,&local_204);
  if ((fbo.m_depthbuffer._3_1_ & 1) != 0) {
    (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  }
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  (*ctx->_vptr_Context[0x80])(ctx,texShader.super_ShaderProgram._336_8_,0,0,0x80,0x80);
  Framebuffer::~Framebuffer((Framebuffer *)local_1d0);
  SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_178);
  return;
}

Assistant:

void RecreateBuffersTest<Buffers>::render (sglr::Context& ctx, Surface& dst)
{
	SingleTex2DShader	texShader;
	deUint32			texShaderID		= ctx.createProgram(&texShader);
	int					width			= 128;
	int					height			= 128;
	deUint32			metaballsTex	= 1;
	deUint32			quadsTex		= 2;
	bool				stencil			= getConfig().stencilbufferType != GL_NONE;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(ctx, getConfig(), width, height);
	fbo.checkCompleteness();

	// Setup shader
	texShader.setUnit(ctx, texShaderID, 0);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	ctx.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	ctx.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (stencil)
	{
		ctx.enable(GL_SCISSOR_TEST);
		ctx.scissor(width/4, height/4, width/2, height/2);
		ctx.clearStencil(1);
		ctx.clear(GL_STENCIL_BUFFER_BIT);
		ctx.disable(GL_SCISSOR_TEST);
	}

	// Recreate buffers
	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	if (Buffers & GL_COLOR_BUFFER_BIT)
	{
		deUint32 colorbuf = fbo.getColorbuffer();
		switch (fbo.getConfig().colorbufferType)
		{
			case GL_TEXTURE_2D:
				ctx.deleteTextures(1, &colorbuf);
				ctx.bindTexture(GL_TEXTURE_2D, colorbuf);
				ctx.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().colorbufferFormat, width, height);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

				if (m_rebind)
					ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorbuf, 0);
				break;

			case GL_RENDERBUFFER:
				ctx.deleteRenderbuffers(1, &colorbuf);
				ctx.bindRenderbuffer(GL_RENDERBUFFER, colorbuf);
				ctx.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().colorbufferFormat, width, height);

				if (m_rebind)
					ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorbuf);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (Buffers & GL_DEPTH_BUFFER_BIT)
	{
		deUint32 depthbuf = fbo.getDepthbuffer();
		DE_ASSERT(fbo.getConfig().depthbufferType == GL_RENDERBUFFER);

		ctx.deleteRenderbuffers(1, &depthbuf);
		ctx.bindRenderbuffer(GL_RENDERBUFFER, depthbuf);
		ctx.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().depthbufferFormat, width, height);

		if (m_rebind)
			ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthbuf);
	}

	if (Buffers & GL_STENCIL_BUFFER_BIT)
	{
		deUint32 stencilbuf = fbo.getStencilbuffer();
		DE_ASSERT(fbo.getConfig().stencilbufferType == GL_RENDERBUFFER);

		ctx.deleteRenderbuffers(1, &stencilbuf);
		ctx.bindRenderbuffer(GL_RENDERBUFFER, stencilbuf);
		ctx.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().stencilbufferFormat, width, height);

		if (m_rebind)
			ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, stencilbuf);
	}

	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());

	ctx.clearColor(0.0f, 0.0f, 1.0f, 0.0f);
	ctx.clearStencil(0);
	ctx.clear(Buffers); // \note Clear only buffers that were re-created

	if (stencil)
	{
		// \note Stencil test enabled only if we have stencil buffer
		ctx.enable(GL_STENCIL_TEST);
		ctx.stencilFunc(GL_EQUAL, 0, 0xffu);
	}
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));
	if (stencil)
		ctx.disable(GL_STENCIL_TEST);

	ctx.disable(GL_DEPTH_TEST);

	// Read from fbo
	ctx.readPixels(dst, 0, 0, width, height);
}